

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O1

void __thiscall CLI::AutoTimer::AutoTimer(AutoTimer *this,string *title,time_print_t *time_print)

{
  pointer pcVar1;
  string local_58;
  _Any_data local_38;
  code *local_28;
  
  pcVar1 = (title->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + title->_M_string_length);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_38,time_print);
  Timer::Timer(&this->super_Timer,&local_58,(time_print_t *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

AutoTimer(std::string title = "Timer", time_print_t time_print = Simple) : Timer(title, time_print) {}